

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall
HTTPRequestTracker::RemoveConnection(HTTPRequestTracker *this,evhttp_connection *conn)

{
  evhttp_connection **__k;
  __node_base_ptr p_Var1;
  _Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false> it;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  evhttp_connection *local_28;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_owns = false;
  local_28 = conn;
  local_20._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_20);
  __k = inline_assertion_check<true,evhttp_connection_const*&>
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                   ,0xc2,"RemoveConnection","conn");
  p_Var1 = std::
           _Hashtable<const_evhttp_connection_*,_std::pair<const_evhttp_connection_*const,_unsigned_long>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_evhttp_connection_*>,_std::hash<const_evhttp_connection_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_tracker)._M_h,(ulong)*__k % (this->m_tracker)._M_h._M_bucket_count,
                      __k,(__hash_code)*__k);
  if (p_Var1 == (__node_base_ptr)0x0) {
    it._M_cur = (__node_type *)0x0;
  }
  else {
    it._M_cur = (__node_type *)p_Var1->_M_nxt;
  }
  if (it._M_cur != (__node_type *)0x0) {
    RemoveConnectionInternal(this,(iterator)it._M_cur);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto it{m_tracker.find(Assert(conn))};
        if (it != m_tracker.end()) RemoveConnectionInternal(it);
    }